

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_command * nk__begin(nk_context *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  void *pvVar3;
  nk_cursor *img;
  nk_size nVar4;
  void *pvVar5;
  nk_window *pnVar6;
  nk_window *pnVar7;
  nk_size nVar8;
  nk_rect r;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x3f8c,"const struct nk_command *nk__begin(struct nk_context *)");
  }
  if (ctx->count != 0) {
    pvVar3 = (ctx->memory).memory.ptr;
    if (ctx->build == 0) {
      if ((ctx->style).cursor_active == (nk_cursor *)0x0) {
        (ctx->style).cursor_active = (ctx->style).cursors[0];
      }
      img = (ctx->style).cursor_active;
      if (((img != (nk_cursor *)0x0) && ((ctx->input).mouse.grabbed == '\0')) &&
         ((ctx->style).cursor_visible != 0)) {
        (ctx->overlay).base = &ctx->memory;
        (ctx->overlay).use_clipping = 0;
        nVar4 = (ctx->memory).allocated;
        (ctx->overlay).begin = nVar4;
        (ctx->overlay).end = nVar4;
        (ctx->overlay).last = nVar4;
        (ctx->overlay).clip = nk_null_rect;
        r.x = (ctx->input).mouse.pos.x - (img->offset).x;
        uVar1 = (img->size).x;
        uVar2 = (img->size).y;
        r.h = (float)uVar2;
        r.w = (float)uVar1;
        r.y = (ctx->input).mouse.pos.y - (img->offset).y;
        nk_draw_image(&ctx->overlay,r,&img->img,(nk_color)0xffffffff);
        (ctx->overlay).end = (ctx->memory).allocated;
      }
      if (ctx->begin != (nk_window *)0x0) {
        pvVar5 = (ctx->memory).memory.ptr;
        pnVar7 = ctx->begin;
        do {
          nVar4 = (pnVar7->buffer).last;
          pnVar6 = pnVar7->next;
          if ((nVar4 != (pnVar7->buffer).begin) && ((pnVar7->flags & 0x1000) == 0)) {
            for (; pnVar6 != (nk_window *)0x0; pnVar6 = pnVar6->next) {
              nVar8 = (pnVar6->buffer).begin;
              if (((pnVar6->buffer).last != nVar8) && ((pnVar6->flags & 0x1000) == 0))
              goto LAB_00120080;
            }
            nVar8 = (ctx->overlay).begin;
            if ((ctx->overlay).end == nVar8) {
              nVar8 = (ctx->memory).allocated;
            }
LAB_00120080:
            *(nk_size *)((long)pvVar5 + nVar4 + 8) = nVar8;
          }
          pnVar7 = pnVar6;
        } while (pnVar6 != (nk_window *)0x0);
      }
      ctx->build = 1;
    }
    pnVar7 = ctx->begin;
    if (pnVar7 != (nk_window *)0x0) {
      while ((nVar4 = (pnVar7->buffer).begin, nVar4 == (pnVar7->buffer).end ||
             ((pnVar7->flags & 0x1000) != 0))) {
        pnVar7 = pnVar7->next;
        if (pnVar7 == (nk_window *)0x0) {
          return (nk_command *)0x0;
        }
      }
      return (nk_command *)((long)pvVar3 + nVar4);
    }
  }
  return (nk_command *)0x0;
}

Assistant:

NK_API const struct nk_command*
nk__begin(struct nk_context *ctx)
{
    struct nk_window *iter;
    nk_byte *buffer;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    if (!ctx->count) return 0;

    buffer = (nk_byte*)ctx->memory.memory.ptr;
    if (!ctx->build) {
        nk_build(ctx);
        ctx->build = nk_true;
    }

    iter = ctx->begin;
    while (iter && ((iter->buffer.begin == iter->buffer.end) || (iter->flags & NK_WINDOW_HIDDEN)))
        iter = iter->next;
    if (!iter) return 0;
    return nk_ptr_add_const(struct nk_command, buffer, iter->buffer.begin);
}